

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalNinjaGenerator::NinjaOutputPath
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,string *path)

{
  bool bVar1;
  
  if (((this->OutputPathPrefix)._M_string_length != 0) &&
     (bVar1 = cmsys::SystemTools::FileIsFullPath(path), !bVar1)) {
    std::operator+(__return_storage_ptr__,&this->OutputPathPrefix,path);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::NinjaOutputPath(
  std::string const& path) const
{
  if (!this->HasOutputPathPrefix() || cmSystemTools::FileIsFullPath(path)) {
    return path;
  }
  return this->OutputPathPrefix + path;
}